

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O1

Value __thiscall
MiniScript::Parser::ParseNot(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  long *plVar1;
  int iVar2;
  ParseState *this_00;
  bool bVar3;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar4;
  anon_union_8_3_2f476f46_for_data extraout_RDX_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX_02;
  Value VVar5;
  Token tok;
  undefined1 local_138 [8];
  anon_union_8_3_2f476f46_for_data local_130;
  Value local_128;
  Value local_118;
  Value local_108;
  Lexer local_f8;
  Lexer local_f0;
  Lexer local_e8;
  Value local_e0;
  Token local_d0;
  TACLine local_b0;
  Token local_50;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  Lexer::Peek(&local_d0,this_01);
  *(undefined2 *)&(this->errorContext).ss = 0;
  *(undefined1 *)((long)&(this->errorContext).ss + 2) = 0;
  if ((local_d0.type == Keyword) && (bVar3 = String::operator==(&local_d0.text,"not"), bVar3)) {
    Lexer::Dequeue(&local_50,this_01);
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar1 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    local_e8.ls = this_01->ls;
    if (local_e8.ls != (LexerStorage *)0x0) {
      (local_e8.ls)->refCount = (local_e8.ls)->refCount + 1;
    }
    AllowLineBreak(&local_e8);
    Lexer::release(&local_e8);
    local_f0.ls = this_01->ls;
    if (local_f0.ls != (LexerStorage *)0x0) {
      (local_f0.ls)->refCount = (local_f0.ls)->refCount + 1;
    }
    ParseIsA((Parser *)local_138,tokens,SUB81(&local_f0,0),false);
    Value::operator=((Value *)this,(Value *)local_138);
    if ((Temp < local_138[0]) && (local_130.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_130.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_130.ref)->_vptr_RefCountedStorage[1])();
      }
      local_130.number = 0.0;
    }
    Lexer::release(&local_f0);
    this_00 = (ParseState *)tokens[6].ls;
    iVar2 = this_00->nextTempNum;
    this_00->nextTempNum = iVar2 + 1;
    local_108.type = Temp;
    local_108.noInvoke = false;
    local_108.localOnly = Off;
    local_108.data.tempNum = iVar2;
    local_128.type = *(ValueType *)&(this->errorContext).ss;
    local_128.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
    local_128.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
    local_128.data =
         (anon_union_8_3_2f476f46_for_data)
         *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
    if ((Temp < local_128.type) && (local_128.data.ref != (RefCountedStorage *)0x0)) {
      (local_128.data.ref)->refCount = (local_128.data.ref)->refCount + 1;
    }
    local_118.type = Value::null;
    local_118.noInvoke = DAT_001d3321._0_1_;
    local_118.localOnly = DAT_001d3321._1_1_;
    local_118.data.ref = DAT_001d3328;
    if ((Temp < Value::null) && (DAT_001d3328 != (RefCountedStorage *)0x0)) {
      DAT_001d3328->refCount = DAT_001d3328->refCount + 1;
    }
    TACLine::TACLine(&local_b0,&local_108,NotA,&local_128,&local_118);
    ParseState::Add(this_00,&local_b0);
    if ((local_b0.location.context.ss != (StringStorage *)0x0) &&
       (local_b0.location.context.isTemp == false)) {
      plVar1 = &((local_b0.location.context.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.location.context.ss = (StringStorage *)0x0;
    }
    if ((local_b0.comment.ss != (StringStorage *)0x0) && (local_b0.comment.isTemp == false)) {
      plVar1 = &((local_b0.comment.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.comment.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_b0.rhsB.type) && (local_b0.rhsB.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_b0.rhsB.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_b0.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.rhsB.data.number = 0.0;
    }
    if ((Temp < local_b0.rhsA.type) && (local_b0.rhsA.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_b0.rhsA.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_b0.rhsA.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.rhsA.data.number = 0.0;
    }
    if ((2 < local_b0.lhs.type) && (local_b0.lhs.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_b0.lhs.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_b0.lhs.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.lhs.data.number = 0.0;
    }
    if ((Temp < local_118.type) && (local_118.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_118.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_118.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_118.data.number = 0.0;
    }
    if ((Temp < local_128.type) && (local_128.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_128.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_128.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_128.data.number = 0.0;
    }
    if ((Temp < local_108.type) &&
       ((ListStorage<MiniScript::TACLine> *)local_108.data.ref !=
        (ListStorage<MiniScript::TACLine> *)0x0)) {
      plVar1 = &(local_108.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_108.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_108.data.number = 0.0;
    }
    local_e0.type = Temp;
    local_e0.noInvoke = false;
    local_e0.localOnly = Off;
    local_e0.data.tempNum = iVar2;
    Value::operator=((Value *)this,&local_e0);
    aVar4 = extraout_RDX;
    if ((Temp < local_e0.type) && (local_e0.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_e0.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_e0.data.ref)->_vptr_RefCountedStorage[1])();
        aVar4 = extraout_RDX_00;
      }
      local_e0.data.number = 0.0;
    }
  }
  else {
    local_f8.ls = this_01->ls;
    if (local_f8.ls != (LexerStorage *)0x0) {
      (local_f8.ls)->refCount = (local_f8.ls)->refCount + 1;
    }
    ParseIsA((Parser *)local_138,tokens,SUB81(&local_f8,0),statementStart);
    Value::operator=((Value *)this,(Value *)local_138);
    if ((Temp < local_138[0]) && (local_130.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_130.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_130.ref)->_vptr_RefCountedStorage[1])();
      }
      local_130.number = 0.0;
    }
    Lexer::release(&local_f8);
    aVar4 = extraout_RDX_01;
  }
  if ((local_d0.text.ss != (StringStorage *)0x0) && (local_d0.text.isTemp == false)) {
    plVar1 = &((local_d0.text.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((local_d0.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      aVar4 = extraout_RDX_02;
    }
  }
  VVar5.data.number = aVar4.number;
  VVar5._0_8_ = this;
  return VVar5;
}

Assistant:

Value Parser::ParseNot(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseIsA;
		Token tok = tokens.Peek();
		Value val;
		if (tok.type == Token::Type::Keyword and tok.text == "not") {
			tokens.Dequeue();		// discard "not"

			AllowLineBreak(tokens); // allow a line break after a unary operator
			
			val = (*this.*nextLevel)(tokens, false, false);
			int tempNum = output->nextTempNum++;
			output->Add(TACLine(Value::Temp(tempNum), TACLine::Op::NotA, val));
			val = Value::Temp(tempNum);
		} else {
			val = (*this.*nextLevel)(tokens, asLval, statementStart);
		}
		return val;
	}